

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_GLSL_start(Context *ctx,char *profilestr)

{
  int iVar1;
  uint uVar2;
  Buffer *pBVar3;
  char *pcVar4;
  
  if (1 < ctx->shader_type - MOJOSHADER_TYPE_PIXEL) {
    failf(ctx,"Shader type %u unsupported in this profile.");
    return;
  }
  iVar1 = strcmp(profilestr,"glsl");
  if (iVar1 == 0) {
    push_output(ctx,&ctx->preflight);
    pcVar4 = "#version 110";
  }
  else {
    iVar1 = strcmp(profilestr,"glsl120");
    if (iVar1 == 0) {
      ctx->profile_supports_glsl120 = 1;
      push_output(ctx,&ctx->preflight);
      pcVar4 = "#version 120";
    }
    else {
      iVar1 = strcmp(profilestr,"glsles");
      if (iVar1 != 0) {
        failf(ctx,"Profile \'%s\' unsupported or unknown.",profilestr);
        return;
      }
      ctx->profile_supports_glsles = 1;
      push_output(ctx,&ctx->preflight);
      output_line(ctx,"#version 100");
      pcVar4 = "precision mediump float;";
      if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
        pcVar4 = "precision highp float;";
      }
      output_line(ctx,pcVar4);
      output_line(ctx,"precision mediump int;");
      output_line(ctx,"varying highp vec4 v_FrontColor;");
      output_line(ctx,"varying highp vec4 v_FrontSecondaryColor;");
      pcVar4 = "varying highp vec4 v_TexCoord[10];";
    }
  }
  output_line(ctx,pcVar4);
  if (ctx->output_stack_len < 1) {
LAB_0010d6f4:
    __assert_fail("ctx->output_stack_len > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                  ,0x173,"void pop_output(Context *)");
  }
  uVar2 = ctx->output_stack_len - 1;
  ctx->output_stack_len = uVar2;
  ctx->output = ctx->output_stack[uVar2];
  ctx->indent = ctx->indent_stack[uVar2];
  push_output(ctx,&ctx->mainline_intro);
  output_line(ctx,"void main()");
  output_line(ctx,"{");
  if (ctx->output_stack_len < 1) goto LAB_0010d6f4;
  uVar2 = ctx->output_stack_len - 1;
  ctx->output_stack_len = uVar2;
  ctx->output = ctx->output_stack[uVar2];
  ctx->indent = ctx->indent_stack[uVar2];
  pBVar3 = ctx->mainline;
  if (pBVar3 == (Buffer *)0x0) {
    pBVar3 = buffer_create(0x100,MallocBridge,FreeBridge,ctx);
    ctx->mainline = pBVar3;
    if (pBVar3 == (Buffer *)0x0) goto LAB_0010d6e6;
  }
  ctx->output = pBVar3;
LAB_0010d6e6:
  ctx->indent = ctx->indent + 1;
  return;
}

Assistant:

static void emit_GLSL_start(Context *ctx, const char *profilestr)
{
    if (!shader_is_vertex(ctx) && !shader_is_pixel(ctx))
    {
        failf(ctx, "Shader type %u unsupported in this profile.",
              (uint) ctx->shader_type);
        return;
    } // if

    else if (strcmp(profilestr, MOJOSHADER_PROFILE_GLSL) == 0)
    {
        // No gl_FragData[] before GLSL 1.10, so we have to force the version.
        push_output(ctx, &ctx->preflight);
        output_line(ctx, "#version 110");
        pop_output(ctx);
    } // else if

    #if SUPPORT_PROFILE_GLSL120
    else if (strcmp(profilestr, MOJOSHADER_PROFILE_GLSL120) == 0)
    {
        ctx->profile_supports_glsl120 = 1;
        push_output(ctx, &ctx->preflight);
        output_line(ctx, "#version 120");
        pop_output(ctx);
    } // else if
    #endif

    #if SUPPORT_PROFILE_GLSLES
    else if (strcmp(profilestr, MOJOSHADER_PROFILE_GLSLES) == 0)
    {
        ctx->profile_supports_glsles = 1;
        push_output(ctx, &ctx->preflight);
        output_line(ctx, "#version 100");
        if (shader_is_vertex(ctx))
            output_line(ctx, "precision highp float;");
        else
            output_line(ctx, "precision mediump float;");
        output_line(ctx, "precision mediump int;");
        // Some drivers don't like it when the precision varies between shaders. -ade
        output_line(ctx, "varying highp vec4 v_FrontColor;");
        output_line(ctx, "varying highp vec4 v_FrontSecondaryColor;");
        output_line(ctx, "varying highp vec4 v_TexCoord[10];"); // 10 according to SM3
        pop_output(ctx);
    } // else if
    #endif

    else
    {
        failf(ctx, "Profile '%s' unsupported or unknown.", profilestr);
        return;
    } // else

    push_output(ctx, &ctx->mainline_intro);
    output_line(ctx, "void main()");
    output_line(ctx, "{");
    pop_output(ctx);

    set_output(ctx, &ctx->mainline);
    ctx->indent++;
}